

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O0

bool __thiscall
cmIfCommand::InvokeInitialPass
          (cmIfCommand *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *param_2)

{
  ulong uVar1;
  cmIfFunctionBlocker *this_00;
  cmIfFunctionBlocker *f;
  undefined1 local_b0 [8];
  string err;
  undefined1 local_88 [7];
  bool isTrue;
  cmConditionEvaluator conditionEvaluator;
  MessageType status;
  undefined1 local_60 [8];
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  cmExecutionStatus *param_2_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args_local;
  cmIfCommand *this_local;
  
  std::__cxx11::string::string
            ((string *)
             &expandedArguments.
              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::vector
            ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
             local_60);
  cmMakefile::ExpandArguments
            ((this->super_cmCommand).Makefile,args,
             (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
             local_60,(char *)0x0);
  cmConditionEvaluator::cmConditionEvaluator
            ((cmConditionEvaluator *)local_88,(this->super_cmCommand).Makefile);
  err.field_2._M_local_buf[0xf] =
       cmConditionEvaluator::IsTrue
                 ((cmConditionEvaluator *)local_88,
                  (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                  local_60,(string *)
                           &expandedArguments.
                            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  &conditionEvaluator.Policy57Status);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmIfCommandError_abi_cxx11_
              ((string *)local_b0,
               (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
               local_60);
    std::__cxx11::string::operator+=
              ((string *)local_b0,
               (string *)
               &expandedArguments.
                super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (conditionEvaluator.Policy57Status != WARN) {
      cmMakefile::IssueMessage
                ((this->super_cmCommand).Makefile,conditionEvaluator.Policy57Status,
                 (string *)local_b0);
    }
    else {
      cmCommand::SetError(&this->super_cmCommand,(string *)local_b0);
      cmSystemTools::SetFatalErrorOccured();
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_b0);
    if (conditionEvaluator.Policy57Status == WARN) goto LAB_00607b66;
  }
  this_00 = (cmIfFunctionBlocker *)operator_new(0x88);
  cmIfFunctionBlocker::cmIfFunctionBlocker(this_00);
  this_00->ScopeDepth = 1;
  this_00->IsBlocking = (bool)((err.field_2._M_local_buf[0xf] ^ 0xffU) & 1);
  if ((err.field_2._M_local_buf[0xf] & 1U) != 0) {
    this_00->HasRun = true;
  }
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::operator=
            (&this_00->Args,args);
  cmMakefile::AddFunctionBlocker((this->super_cmCommand).Makefile,(cmFunctionBlocker *)this_00);
  this_local._7_1_ = 1;
LAB_00607b66:
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
            ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
             local_60);
  std::__cxx11::string::~string
            ((string *)
             &expandedArguments.
              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmIfCommand
::InvokeInitialPass(const std::vector<cmListFileArgument>& args,
                    cmExecutionStatus &)
{
  std::string errorString;

  std::vector<cmExpandedCommandArgument> expandedArguments;
  this->Makefile->ExpandArguments(args, expandedArguments);

  cmake::MessageType status;

  cmConditionEvaluator conditionEvaluator(*(this->Makefile));

  bool isTrue = conditionEvaluator.IsTrue(
    expandedArguments, errorString, status);

  if (!errorString.empty())
    {
    std::string err = cmIfCommandError(expandedArguments);
    err += errorString;
    if (status == cmake::FATAL_ERROR)
      {
      this->SetError(err);
      cmSystemTools::SetFatalErrorOccured();
      return false;
      }
    else
      {
      this->Makefile->IssueMessage(status, err);
      }
    }

  cmIfFunctionBlocker *f = new cmIfFunctionBlocker();
  // if is isn't true block the commands
  f->ScopeDepth = 1;
  f->IsBlocking = !isTrue;
  if (isTrue)
    {
    f->HasRun = true;
    }
  f->Args = args;
  this->Makefile->AddFunctionBlocker(f);

  return true;
}